

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O2

void Gia_ManDupAndConesLimit_rec(Gia_Man_t *pNew,Gia_Man_t *p,int iObj,int Level)

{
  int iVar1;
  uint uVar2;
  int iLit1;
  Gia_Obj_t *pObj;
  
  pObj = Gia_ManObj(p,iObj);
  if (pObj->Value == 0xffffffff) {
    if (((~*(uint *)pObj & 0x1fffffff) == 0 || (int)*(uint *)pObj < 0) ||
       (iVar1 = Gia_ObjLevel(p,pObj), iVar1 < Level)) {
      uVar2 = Gia_ManAppendCi(pNew);
    }
    else {
      Gia_ManDupAndConesLimit_rec(pNew,p,iObj - (*(uint *)pObj & 0x1fffffff),Level);
      Gia_ManDupAndConesLimit_rec(pNew,p,iObj - (*(uint *)&pObj->field_0x4 & 0x1fffffff),Level);
      iVar1 = Gia_ObjFanin0Copy(pObj);
      iLit1 = Gia_ObjFanin1Copy(pObj);
      uVar2 = Gia_ManAppendAnd(pNew,iVar1,iLit1);
    }
    pObj->Value = uVar2;
    return;
  }
  return;
}

Assistant:

void Gia_ManDupAndConesLimit_rec( Gia_Man_t * pNew, Gia_Man_t * p, int iObj, int Level )
{
    Gia_Obj_t * pObj = Gia_ManObj(p, iObj);
    if ( ~pObj->Value )
        return;
    if ( !Gia_ObjIsAnd(pObj) || Gia_ObjLevel(p, pObj) < Level )
    {
        pObj->Value = Gia_ManAppendCi( pNew );
        //printf( "PI %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
        return;
    }
    Gia_ManDupAndConesLimit_rec( pNew, p, Gia_ObjFaninId0(pObj, iObj), Level );
    Gia_ManDupAndConesLimit_rec( pNew, p, Gia_ObjFaninId1(pObj, iObj), Level );
    pObj->Value = Gia_ManAppendAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
    //printf( "Obj %d for %d.\n", Abc_Lit2Var(pObj->Value), iObj );
}